

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O1

void __thiscall mp::QP2Passes::RunPass1(QP2Passes *this)

{
  Impl *pIVar1;
  _Bit_type *p_Var2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  QP2PassVisitor::InitPass1(this->visitor_);
  std::vector<bool,_std::allocator<bool>_>::resize
            (&this->is_term_qp_,
             (long)(int)(this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                        super_ExprBase.impl_[1].kind_,false);
  this->n_qp_terms_ = 0;
  pIVar1 = (this->top_expr_).super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
           impl_;
  lVar7 = (long)(int)pIVar1[1].kind_;
  if (lVar7 != 0) {
    lVar7 = lVar7 << 3;
    uVar8 = 0;
    do {
      bVar3 = QP2PassVisitor::Process
                        (this->visitor_,(ExprBase)*(ExprBase *)&pIVar1[uVar8 * 2 + 2].kind_);
      p_Var2 = (this->is_term_qp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar5 = uVar8 >> 6;
      uVar6 = 1L << ((byte)uVar8 & 0x3f);
      if (bVar3) {
        uVar4 = p_Var2[uVar5] | uVar6;
      }
      else {
        uVar4 = ~uVar6 & p_Var2[uVar5];
      }
      p_Var2[uVar5] = uVar4;
      if ((uVar4 & uVar6) != 0) {
        this->n_qp_terms_ = this->n_qp_terms_ + 1;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + -8;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void QP2Passes::RunPass1() {
  InitPass1();
  auto e0 = GetTopExpr();
  int term_index=0;
  for (auto term_iter=e0.begin(), term_end=e0.end();
       term_end!=term_iter; ++term_iter, ++term_index) {
    if ((is_term_qp_[term_index]             // degree > 2
          = visitor_.Process(*term_iter))) {
      ++n_qp_terms_;
    }
  }
}